

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O0

void divsufsortxx::helper::
     fixdown<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator,long>
               (substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td,iterator SA,long i
               ,long size)

{
  value_type vVar1;
  value_type vVar2;
  long val;
  long in_RCX;
  long in_RDX;
  value_type e;
  value_type d;
  value_type c;
  long t;
  long k;
  long j;
  value_reference *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined1 *i_00;
  iterator *this;
  undefined1 in_stack_ffffffffffffff60 [16];
  char local_3a;
  long local_30;
  long local_18;
  
  i_00 = &stack0x00000008;
  bitmap::BitmapArray<long>::iterator::operator[]
            (in_stack_ffffffffffffff60._0_8_,(difference_type)i_00);
  val = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11b48d);
  vVar1 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    (in_stack_ffffffffffffff60._0_8_,(size_type)i_00);
  local_18 = in_RDX;
  while( true ) {
    this = in_stack_ffffffffffffff60._0_8_;
    local_30 = local_18 * 2 + 1;
    if (in_RCX <= local_30) break;
    bitmap::BitmapArray<long>::iterator::operator[](this,(difference_type)i_00);
    bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11b510);
    local_3a = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                         (in_stack_ffffffffffffff60._0_8_,(size_type)i_00);
    in_stack_ffffffffffffff54 = (int)local_3a;
    bitmap::BitmapArray<long>::iterator::operator[]
              (in_stack_ffffffffffffff60._0_8_,(difference_type)i_00);
    bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11b553);
    vVar2 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                      (in_stack_ffffffffffffff60._0_8_,(size_type)i_00);
    this = in_stack_ffffffffffffff60._0_8_;
    if (in_stack_ffffffffffffff54 < vVar2) {
      local_3a = vVar2;
      local_30 = local_18 * 2 + 2;
    }
    if (local_3a <= vVar1) break;
    bitmap::BitmapArray<long>::iterator::operator[](this,(difference_type)i_00);
    bitmap::BitmapArray<long>::iterator::operator[]
              (in_stack_ffffffffffffff60._0_8_,(difference_type)i_00);
    bitmap::BitmapArray<long>::value_reference::operator=
              ((value_reference *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    local_18 = local_30;
  }
  bitmap::BitmapArray<long>::iterator::operator[](this,(difference_type)i_00);
  bitmap::BitmapArray<long>::value_reference::operator=
            ((value_reference *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),val);
  return;
}

Assistant:

void fixdown(const StringIterator_type Td, SAIterator_type SA, pos_type i,
             pos_type size) {
  typedef typename std::iterator_traits<StringIterator_type>::value_type value_type;
  pos_type j, k, t;
  value_type c, d, e;

  for (t = SA[i], c = Td[t]; (j = 2 * i + 1) < size; SA[i] = SA[k], i = k) {
    d = Td[SA[k = j++]];
    if (d < (e = Td[SA[j]])) {
      k = j;
      d = e;
    }
    if (d <= c) {
      break;
    }
  }
  SA[i] = t;
}